

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  char cVar1;
  byte bVar2;
  ImGuiWindow *pIVar3;
  short sVar4;
  ImGuiTableColumnFlags IVar5;
  ImU32 id;
  char *pcVar6;
  ImGuiTableColumn *pIVar7;
  ImGuiTableColumn *pIVar8;
  byte *pbVar9;
  uint uVar10;
  bool bVar11;
  float rhs;
  float fVar12;
  float fVar13;
  float fVar14;
  float y2;
  byte local_142;
  bool local_141;
  float local_140;
  ImGuiWindow *inner_window;
  ImGuiID context_menu_id;
  float unused_x1;
  float initial_max_pos_x;
  float max_x;
  ImGuiTableColumn *column_3;
  int local_d8;
  int column_n_1;
  int order_n_3;
  ImRect host_clip_rect;
  float offset_x;
  int visible_n;
  bool is_hovering_table;
  ImRect mouse_hit_rect;
  ImGuiTableColumn *column_2;
  int order_n_2;
  ImGuiTableColumn *next_column;
  float weight_ratio;
  ImGuiTableColumn *column_1;
  int local_78;
  int order_n_1;
  int count_resizable;
  float width_remaining_for_stretched_columns;
  float width_avail_for_stretched_columns;
  float width_avail;
  float width_spacings;
  int init_size;
  bool auto_fit;
  float column_width_ideal;
  float column_content_width_headers;
  float column_content_width_rows;
  ImGuiTableColumn *column;
  int column_n;
  int order_n;
  float sum_width_fixed_requests;
  float sum_weights_stretched;
  int count_fixed;
  float min_column_width;
  float spacing_auto_x;
  float padding_auto_x;
  ImRect work_rect;
  ImGuiContext *g;
  ImGuiTable *table_local;
  
  work_rect.Max = (ImVec2)GImGui;
  if ((table->IsLayoutLocked & 1U) != 0) {
    __assert_fail("table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                  ,0x2145,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  _spacing_auto_x = (table->WorkRect).Min;
  work_rect.Min = (table->WorkRect).Max;
  fVar13 = table->CellPaddingX2;
  fVar14 = table->CellSpacingX;
  rhs = TableGetMinColumnWidth();
  order_n = 0;
  column_n = 0;
  table->LeftMostStretchedColumnDisplayOrder = -1;
  table->ColumnsAutoFitWidth = 0.0;
  column._4_4_ = 0;
  do {
    if (table->ColumnsCount <= column._4_4_) {
      table->ColumnsAutoFitWidth =
           fVar14 * 3.0 * (float)(table->ColumnsVisibleCount + -1) + table->ColumnsAutoFitWidth;
      fVar13 = table->CellSpacingX * (float)(table->ColumnsVisibleCount + -1);
      if ((((table->Flags & 0x40000U) == 0) || (table->InnerWidth != 0.0)) ||
         (NAN(table->InnerWidth))) {
        fVar14 = ImRect::GetWidth((ImRect *)&spacing_auto_x);
      }
      else {
        fVar14 = ImRect::GetWidth(&table->InnerClipRect);
      }
      width_remaining_for_stretched_columns = fVar14 - fVar13;
      local_78 = 0;
      table->ColumnsTotalWidth = fVar13;
      order_n_1 = (int)(width_remaining_for_stretched_columns - (float)column_n);
      for (column_1._4_4_ = 0; column_1._4_4_ < table->ColumnsCount;
          column_1._4_4_ = column_1._4_4_ + 1) {
        if ((table->VisibleMaskByDisplayOrder & 1L << ((byte)column_1._4_4_ & 0x3f)) != 0) {
          pcVar6 = ImSpan<signed_char>::operator[](&table->DisplayOrderToIndex,column_1._4_4_);
          pIVar7 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)*pcVar6);
          if ((pIVar7->Flags & 8U) != 0) {
            fVar13 = ImMax<float>((width_remaining_for_stretched_columns - (float)column_n) *
                                  (pIVar7->WidthStretchWeight / (float)order_n),rhs);
            pIVar7->WidthRequest = (float)(int)(fVar13 + 0.01);
            order_n_1 = (int)((float)order_n_1 - pIVar7->WidthRequest);
            if (((pIVar7->NextVisibleColumn != -1) &&
                (pIVar8 = ImSpan<ImGuiTableColumn>::operator[]
                                    (&table->Columns,(int)pIVar7->NextVisibleColumn),
                pIVar8 != (ImGuiTableColumn *)0x0)) && ((pIVar8->Flags & 4U) != 0)) {
              pIVar7->Flags = pIVar8->Flags & 0x100000U | pIVar7->Flags;
            }
          }
          if ((pIVar7->NextVisibleColumn == -1) &&
             (table->LeftMostStretchedColumnDisplayOrder != -1)) {
            pIVar7->Flags = pIVar7->Flags | 0x100000;
          }
          if ((pIVar7->Flags & 0x20U) == 0) {
            local_78 = local_78 + 1;
          }
          fVar13 = ImMax<float>(pIVar7->WidthRequest,rhs);
          fVar13 = ImFloor(fVar13);
          pIVar7->WidthGiven = fVar13;
          table->ColumnsTotalWidth = pIVar7->WidthGiven + table->ColumnsTotalWidth;
        }
      }
      if (1.0 <= (float)order_n_1) {
        column_2._4_4_ = table->ColumnsCount;
        while( true ) {
          column_2._4_4_ = column_2._4_4_ + -1;
          bVar11 = false;
          if ((0.0 < (float)order_n) && (bVar11 = false, 1.0 <= (float)order_n_1)) {
            bVar11 = -1 < column_2._4_4_;
          }
          if (!bVar11) break;
          if ((table->VisibleMaskByDisplayOrder & 1L << ((byte)column_2._4_4_ & 0x3f)) != 0) {
            pcVar6 = ImSpan<signed_char>::operator[](&table->DisplayOrderToIndex,column_2._4_4_);
            mouse_hit_rect.Max =
                 (ImVec2)ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)*pcVar6);
            if ((*(ImGuiTableColumnFlags *)((long)mouse_hit_rect.Max + 0x18) & 8U) != 0) {
              *(float *)((long)mouse_hit_rect.Max + 0x28) =
                   *(float *)((long)mouse_hit_rect.Max + 0x28) + 1.0;
              *(float *)((long)mouse_hit_rect.Max + 0x2c) =
                   *(float *)((long)mouse_hit_rect.Max + 0x2c) + 1.0;
              order_n_1 = (int)((float)order_n_1 - 1.0);
            }
          }
        }
      }
      fVar13 = (table->OuterRect).Min.x;
      fVar14 = (table->OuterRect).Min.y;
      fVar12 = (table->OuterRect).Max.x;
      y2 = ImMax<float>((table->OuterRect).Max.y,(table->OuterRect).Min.y + table->LastOuterHeight);
      ImRect::ImRect((ImRect *)&visible_n,fVar13,fVar14,fVar12,y2);
      bVar11 = ItemHoverable((ImRect *)&visible_n,0);
      host_clip_rect.Max.y = 0.0;
      if (table->FreezeColumnsCount < '\x01') {
        local_140 = spacing_auto_x;
      }
      else {
        local_140 = (table->OuterRect).Min.x;
      }
      host_clip_rect.Max.x = local_140;
      _column_n_1 = (table->InnerClipRect).Min;
      host_clip_rect.Min = (table->InnerClipRect).Max;
      for (local_d8 = 0; local_d8 < table->ColumnsCount; local_d8 = local_d8 + 1) {
        pbVar9 = (byte *)ImSpan<signed_char>::operator[](&table->DisplayOrderToIndex,local_d8);
        bVar2 = *pbVar9;
        pIVar7 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)(char)bVar2);
        if (('\0' < table->FreezeColumnsCount) &&
           ((float)(int)table->FreezeColumnsCount == host_clip_rect.Max.y)) {
          host_clip_rect.Max.x = (spacing_auto_x - (table->OuterRect).Min.x) + host_clip_rect.Max.x;
        }
        if ((table->VisibleMaskByDisplayOrder & 1L << ((byte)local_d8 & 0x3f)) == 0) {
          pIVar7->MaxX = host_clip_rect.Max.x;
          pIVar7->MinX = host_clip_rect.Max.x;
          pIVar7->StartXHeaders = host_clip_rect.Max.x;
          pIVar7->StartXRows = host_clip_rect.Max.x;
          pIVar7->WidthGiven = 0.0;
          (pIVar7->ClipRect).Min.x = host_clip_rect.Max.x;
          (pIVar7->ClipRect).Min.y = padding_auto_x;
          (pIVar7->ClipRect).Max.x = host_clip_rect.Max.x;
          (pIVar7->ClipRect).Max.y = 3.4028235e+38;
          ImRect::ClipWithFull(&pIVar7->ClipRect,(ImRect *)&column_n_1);
          pIVar7->SkipItems = true;
          pIVar7->IsClipped = true;
        }
        else {
          unused_x1 = 3.4028235e+38;
          if ((table->Flags & 0x40000U) == 0) {
            if ((table->Flags & 0x20000U) == 0) {
              unused_x1 = -(float)(table->ColumnsVisibleCount - (pIVar7->IndexWithinVisibleSet + 1))
                          * rhs + (table->WorkRect).Max.x;
            }
          }
          else if (local_d8 < table->FreezeColumnsRequest) {
            unused_x1 = -(float)(table->FreezeColumnsRequest - local_d8) * rhs +
                        (table->InnerClipRect).Max.x;
          }
          if (unused_x1 < host_clip_rect.Max.x + pIVar7->WidthGiven) {
            fVar13 = ImMax<float>(unused_x1 - host_clip_rect.Max.x,rhs);
            pIVar7->WidthGiven = fVar13;
          }
          pIVar7->MinX = host_clip_rect.Max.x;
          pIVar7->MaxX = pIVar7->MinX + pIVar7->WidthGiven;
          (pIVar7->ClipRect).Min.x = pIVar7->MinX;
          (pIVar7->ClipRect).Min.y = padding_auto_x;
          (pIVar7->ClipRect).Max.x = pIVar7->MaxX;
          (pIVar7->ClipRect).Max.y = 3.4028235e+38;
          ImRect::ClipWithFull(&pIVar7->ClipRect,(ImRect *)&column_n_1);
          local_141 = false;
          if (((pIVar7->ClipRect).Max.x <= (pIVar7->ClipRect).Min.x) &&
             (local_141 = false, (pIVar7->AutoFitQueue & 1U) == 0)) {
            local_141 = (pIVar7->CannotSkipItemsQueue & 1U) == 0;
          }
          pIVar7->IsClipped = local_141;
          if ((pIVar7->IsClipped & 1U) != 0) {
            table->VisibleUnclippedMaskByIndex =
                 (1L << (bVar2 & 0x3f) ^ 0xffffffffffffffffU) & table->VisibleUnclippedMaskByIndex;
          }
          local_142 = 1;
          if ((pIVar7->IsVisible & 1U) != 0) {
            local_142 = table->HostSkipItems;
          }
          pIVar7->SkipItems = (bool)(local_142 & 1);
          if (((bVar11) && ((pIVar7->ClipRect).Min.x <= *(float *)((long)work_rect.Max + 0x128))) &&
             (*(float *)((long)work_rect.Max + 0x128) < (pIVar7->ClipRect).Max.x)) {
            table->HoveredColumnBody = bVar2;
          }
          fVar13 = pIVar7->MinX + table->CellPaddingX1;
          pIVar7->StartXHeaders = fVar13;
          pIVar7->StartXRows = fVar13;
          fVar13 = pIVar7->MinX + table->CellPaddingX1;
          pIVar7->ContentMaxPosRowsUnfrozen = fVar13;
          pIVar7->ContentMaxPosRowsFrozen = fVar13;
          pIVar7->ContentMaxPosHeadersIdeal = fVar13;
          pIVar7->ContentMaxPosHeadersUsed = fVar13;
          if ((table->HostSkipItems & 1U) == 0) {
            pIVar7->AutoFitQueue = pIVar7->AutoFitQueue >> 1;
            pIVar7->CannotSkipItemsQueue = pIVar7->CannotSkipItemsQueue >> 1;
          }
          if ((int)host_clip_rect.Max.y < (int)table->FreezeColumnsCount) {
            fVar13 = ImMax<float>((float)column_n_1,pIVar7->MaxX + 2.0);
            column_n_1 = (int)fVar13;
          }
          host_clip_rect.Max.x = pIVar7->WidthGiven + table->CellSpacingX + host_clip_rect.Max.x;
          host_clip_rect.Max.y = (float)((int)host_clip_rect.Max.y + 1);
        }
      }
      if ((bVar11) && (table->HoveredColumnBody == -1)) {
        inner_window._4_4_ = (table->WorkRect).Min.x;
        if (table->RightMostVisibleColumn != -1) {
          pIVar7 = ImSpan<ImGuiTableColumn>::operator[]
                             (&table->Columns,(int)table->RightMostVisibleColumn);
          inner_window._4_4_ = ImMax<float>(inner_window._4_4_,(pIVar7->ClipRect).Max.x);
        }
        if (inner_window._4_4_ <= *(float *)((long)work_rect.Max + 0x128)) {
          table->HoveredColumnBody = (ImS8)table->ColumnsCount;
        }
      }
      if ((local_78 == 0) && ((table->Flags & 1U) != 0)) {
        table->Flags = table->Flags & 0xfffffffe;
      }
      TableUpdateDrawChannels(table);
      if ((table->Flags & 1U) != 0) {
        TableUpdateBorders(table);
      }
      table->LastFirstRowHeight = 0.0;
      table->IsLayoutLocked = true;
      table->IsUsingHeaders = false;
      if (((table->IsContextPopupOpen & 1U) != 0) &&
         (table->InstanceCurrent == table->InstanceInteracted)) {
        id = ImHashStr("##ContextMenu",0,table->ID);
        bVar11 = BeginPopupEx(id,0x141);
        if (bVar11) {
          TableDrawContextMenu(table);
          EndPopup();
        }
        else {
          table->IsContextPopupOpen = false;
        }
      }
      pIVar3 = table->InnerWindow;
      if ((table->Flags & 0x1000U) == 0) {
        ImDrawList::PushClipRect
                  (pIVar3->DrawList,(pIVar3->ClipRect).Min,(pIVar3->ClipRect).Max,false);
      }
      else {
        ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar3->DrawList,1);
      }
      if (((table->IsSortSpecsDirty & 1U) != 0) && ((table->Flags & 8U) != 0)) {
        TableSortSpecsBuild(table);
      }
      return;
    }
    if ((table->VisibleMaskByDisplayOrder & 1L << ((byte)column._4_4_ & 0x3f)) != 0) {
      pcVar6 = ImSpan<signed_char>::operator[](&table->DisplayOrderToIndex,column._4_4_);
      cVar1 = *pcVar6;
      pIVar7 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)cVar1);
      IVar5 = TableFixColumnFlags(table,pIVar7->FlagsIn);
      pIVar7->Flags = IVar5;
      if ((pIVar7->Flags & 0xc000U) == 0) {
        uVar10 = 0x8000;
        if (cVar1 == 0) {
          uVar10 = 0x4000;
        }
        pIVar7->Flags = uVar10 | pIVar7->Flags;
      }
      if ((table->Flags & 8U) != 0) {
        TableFixColumnSortDirection(pIVar7);
      }
      sVar4 = ImMax<short>(pIVar7->ContentWidthRowsFrozen,pIVar7->ContentWidthRowsUnfrozen);
      init_size = (int)(float)(int)sVar4;
      if (((table->Flags & 0x8000U) == 0) && ((pIVar7->Flags & 0x800U) == 0)) {
        init_size = (int)ImMax<float>((float)init_size,(float)(int)pIVar7->ContentWidthHeadersIdeal)
        ;
      }
      fVar12 = ImMax<float>((float)init_size + fVar13,rhs);
      table->ColumnsAutoFitWidth = fVar12 + table->ColumnsAutoFitWidth;
      if ((pIVar7->Flags & 0x14U) == 0) {
        if ((pIVar7->Flags & 8U) == 0) {
          __assert_fail("column->Flags & ImGuiTableColumnFlags_WidthStretch",
                        "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                        ,0x2187,"void ImGui::TableUpdateLayout(ImGuiTable *)");
        }
        if (pIVar7->WidthStretchWeight <= 0.0 && pIVar7->WidthStretchWeight != 0.0) {
          pIVar7->WidthStretchWeight = 1.0;
        }
        order_n = (int)(pIVar7->WidthStretchWeight + (float)order_n);
        if (table->LeftMostStretchedColumnDisplayOrder == -1) {
          table->LeftMostStretchedColumnDisplayOrder = pIVar7->DisplayOrder;
        }
      }
      else {
        bVar11 = true;
        if (pIVar7->AutoFitQueue == '\0') {
          bVar11 = (pIVar7->Flags & 0x10U) != 0;
        }
        if (((bVar11) && (pIVar7->WidthRequest = fVar12, '\x01' < pIVar7->AutoFitQueue)) &&
           ((table->IsInitializing & 1U) != 0)) {
          fVar12 = ImMax<float>(pIVar7->WidthRequest,rhs * 4.0);
          pIVar7->WidthRequest = fVar12;
        }
        column_n = (int)(pIVar7->WidthRequest + (float)column_n);
      }
    }
    column._4_4_ = column._4_4_ + 1;
  } while( true );
}

Assistant:

void    ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;

    // Compute offset, clip rect for the frame
    // (can't make auto padding larger than what WorkRect knows about so right-alignment matches)
    const ImRect work_rect = table->WorkRect;
    const float padding_auto_x = table->CellPaddingX2;
    const float spacing_auto_x = table->CellSpacingX * (1.0f + 2.0f); // CellSpacingX is >0.0f when there's no vertical border, in which case we add two extra CellSpacingX to make auto-fit look nice instead of cramped. We may want to expose this somehow.
    const float min_column_width = TableGetMinColumnWidth();

    int count_fixed = 0;
    float sum_weights_stretched = 0.0f;     // Sum of all weights for weighted columns.
    float sum_width_fixed_requests = 0.0f;  // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns.
    table->LeftMostStretchedColumnDisplayOrder = -1;
    table->ColumnsAutoFitWidth = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Adjust flags: default width mode + weighted columns are not allowed when auto extending
        // FIXME-TABLE: Clarify why we need to do this again here and not just in TableSetupColumn()
        column->Flags = TableFixColumnFlags(table, column->FlagsIn);
        if ((column->Flags & ImGuiTableColumnFlags_IndentMask_) == 0)
            column->Flags |= (column_n == 0) ? ImGuiTableColumnFlags_IndentEnable : ImGuiTableColumnFlags_IndentDisable;

        // We have a unusual edge case where if the user doesn't call TableGetSortSpecs() but has sorting enabled
        // or varying sorting flags, we still want the sorting arrows to honor those flags.
        if (table->Flags & ImGuiTableFlags_Sortable)
            TableFixColumnSortDirection(column);

        // Calculate "ideal" column width for nothing to be clipped.
        // Combine width from regular rows + width from headers unless requested not to.
        const float column_content_width_rows = (float)ImMax(column->ContentWidthRowsFrozen, column->ContentWidthRowsUnfrozen);
        const float column_content_width_headers = (float)column->ContentWidthHeadersIdeal;
        float column_width_ideal = column_content_width_rows;
        if (!(table->Flags & ImGuiTableFlags_NoHeadersWidth) && !(column->Flags & ImGuiTableColumnFlags_NoHeaderWidth))
            column_width_ideal = ImMax(column_width_ideal, column_content_width_headers);
        column_width_ideal = ImMax(column_width_ideal + padding_auto_x, min_column_width);
        table->ColumnsAutoFitWidth += column_width_ideal;

        if (column->Flags & (ImGuiTableColumnFlags_WidthAlwaysAutoResize | ImGuiTableColumnFlags_WidthFixed))
        {
            // Latch initial size for fixed columns
            count_fixed += 1;
            const bool auto_fit = (column->AutoFitQueue != 0x00) || (column->Flags & ImGuiTableColumnFlags_WidthAlwaysAutoResize);
            if (auto_fit)
            {
                column->WidthRequest = column_width_ideal;

                // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
                // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
                // large height (= first frame scrollbar display very off + clipper would skip lots of items).
                // This is merely making the side-effect less extreme, but doesn't properly fixes it.
                // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
                if (column->AutoFitQueue > 0x01 && table->IsInitializing)
                    column->WidthRequest = ImMax(column->WidthRequest, min_column_width * 4.0f);
            }
            sum_width_fixed_requests += column->WidthRequest;
        }
        else
        {
            IM_ASSERT(column->Flags & ImGuiTableColumnFlags_WidthStretch);
            const int init_size = (column->WidthStretchWeight < 0.0f);
            if (init_size)
                column->WidthStretchWeight = 1.0f;
            sum_weights_stretched += column->WidthStretchWeight;
            if (table->LeftMostStretchedColumnDisplayOrder == -1)
                table->LeftMostStretchedColumnDisplayOrder = (ImS8)column->DisplayOrder;
        }
    }

    // CellSpacingX is >0.0f when there's no vertical border, in which case we add two extra CellSpacingX to make auto-fit look nice instead of cramped.
    // We may want to expose this somehow.
    table->ColumnsAutoFitWidth += spacing_auto_x * (table->ColumnsVisibleCount - 1);

    // Layout
    const float width_spacings = table->CellSpacingX * (table->ColumnsVisibleCount - 1);
    float width_avail;
    if ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f)
        width_avail = table->InnerClipRect.GetWidth() - width_spacings;
    else
        width_avail = work_rect.GetWidth() - width_spacings;
    const float width_avail_for_stretched_columns = width_avail - sum_width_fixed_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;

    // Apply final width based on requested widths
    // Mark some columns as not resizable
    int count_resizable = 0;
    table->ColumnsTotalWidth = width_spacings;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];

        // Allocate width for stretched/weighted columns
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            // WidthStretchWeight gets converted into WidthRequest
            float weight_ratio = column->WidthStretchWeight / sum_weights_stretched;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, min_column_width) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;

            // [Resize Rule 2] Resizing from right-side of a weighted column preceding a fixed column
            // needs to forward resizing to left-side of fixed column. We also need to copy the NoResize flag..
            if (column->NextVisibleColumn != -1)
                if (ImGuiTableColumn* next_column = &table->Columns[column->NextVisibleColumn])
                    if (next_column->Flags & ImGuiTableColumnFlags_WidthFixed)
                        column->Flags |= (next_column->Flags & ImGuiTableColumnFlags_NoDirectResize_);
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // (see comments in TableResizeColumn())
        if (column->NextVisibleColumn == -1 && table->LeftMostStretchedColumnDisplayOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        if (!(column->Flags & ImGuiTableColumnFlags_NoResize))
            count_resizable++;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, min_column_width));
        table->ColumnsTotalWidth += column->WidthGiven;
    }

#if 0
    const float width_excess = table->ColumnsTotalWidth - work_rect.GetWidth();
    if ((table->Flags & ImGuiTableFlags_SizingPolicyStretchX) && width_excess > 0.0f)
    {
        // Shrink widths when the total does not fit
        // FIXME-TABLE: This is working but confuses/conflicts with manual resizing.
        // FIXME-TABLE: Policy to shrink down below below ideal/requested width if there's no room?
        g.ShrinkWidthBuffer.resize(table->ColumnsVisibleCount);
        for (int order_n = 0, visible_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            const int column_n = table->DisplayOrder[order_n];
            g.ShrinkWidthBuffer[visible_n].Index = column_n;
            g.ShrinkWidthBuffer[visible_n].Width = table->Columns[column_n].WidthGiven;
            visible_n++;
        }
        ShrinkWidths(g.ShrinkWidthBuffer.Data, g.ShrinkWidthBuffer.Size, width_excess);
        for (int n = 0; n < g.ShrinkWidthBuffer.Size; n++)
            table->Columns[g.ShrinkWidthBuffer.Data[n].Index].WidthGiven = ImMax(g.ShrinkWidthBuffer.Data[n].Width, min_column_size);
        // FIXME: Need to alter table->ColumnsTotalWidth
    }
    else
#endif

    // Redistribute remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor), could be adjusted depending
    // on where the mouse cursor is and/or relative weights.
    // FIXME-TABLE: May be simpler to store floating width and floor final positions only
    // FIXME-TABLE: Make it optional? User might prefer to preserve pixel perfect same size?
    if (width_remaining_for_stretched_columns >= 1.0f)
        for (int order_n = table->ColumnsCount - 1; sum_weights_stretched > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    // Detect hovered column
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // Setup final position, offset and clipping rectangles
    int visible_n = 0;
    float offset_x = (table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x;
    ImRect host_clip_rect = table->InnerClipRect;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        if (table->FreezeColumnsCount > 0 && table->FreezeColumnsCount == visible_n)
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;

        if ((table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = offset_x;
            column->StartXRows = column->StartXHeaders = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.x = offset_x;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.x = offset_x;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsClipped = column->SkipItems = true;
            continue;
        }

        float max_x = FLT_MAX;
        if (table->Flags & ImGuiTableFlags_ScrollX)
        {
            // Frozen columns can't reach beyond visible width else scrolling will naturally break.
            if (order_n < table->FreezeColumnsRequest)
                max_x = table->InnerClipRect.Max.x - (table->FreezeColumnsRequest - order_n) * min_column_width;
        }
        else
        {
            // If horizontal scrolling if disabled, we apply a final lossless shrinking of columns in order to make
            // sure they are all visible. Because of this we also know that all of the columns will always fit in
            // table->WorkRect and therefore in table->InnerRect (because ScrollX is off)
            if (!(table->Flags & ImGuiTableFlags_NoKeepColumnsVisible))
                max_x = table->WorkRect.Max.x - (table->ColumnsVisibleCount - (column->IndexWithinVisibleSet + 1)) * min_column_width;
        }
        if (offset_x + column->WidthGiven > max_x)
            column->WidthGiven = ImMax(max_x - offset_x, min_column_width);

        column->MinX = offset_x;
        column->MaxX = column->MinX + column->WidthGiven;

        //// A one pixel padding on the right side makes clipping more noticeable and contents look less cramped.
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX;// -1.0f;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        column->IsClipped = (column->ClipRect.Max.x <= column->ClipRect.Min.x) && (column->AutoFitQueue & 1) == 0 && (column->CannotSkipItemsQueue & 1) == 0;
        if (column->IsClipped)
            table->VisibleUnclippedMaskByIndex &= ~((ImU64)1 << column_n);  // Columns with the _WidthAlwaysAutoResize sizing policy will never be updated then.

        column->SkipItems = !column->IsVisible || table->HostSkipItems;

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImS8)column_n;

        // Starting cursor position
        column->StartXRows = column->StartXHeaders = column->MinX + table->CellPaddingX1;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->StartXRows = ImMax(column->StartXRows, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->StartXRows = ImLerp(column->StartXRows, ImMax(column->StartXRows, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        const float initial_max_pos_x = column->MinX + table->CellPaddingX1;
        column->ContentMaxPosRowsFrozen = column->ContentMaxPosRowsUnfrozen = initial_max_pos_x;
        column->ContentMaxPosHeadersUsed = column->ContentMaxPosHeadersIdeal = initial_max_pos_x;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImMax(host_clip_rect.Min.x, column->MaxX + 2.0f);

        offset_x += column->WidthGiven + table->CellSpacingX;
        visible_n++;
    }

    // Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        float unused_x1 = table->WorkRect.Min.x;
        if (table->RightMostVisibleColumn != -1)
            unused_x1 = ImMax(unused_x1, table->Columns[table->RightMostVisibleColumn].ClipRect.Max.x);
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImS8)table->ColumnsCount;
    }

    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag,
    // either because of using _WidthAlwaysAutoResize/_WidthStretch).
    // This will hide the resizing option from the context menu.
    if (count_resizable == 0 && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // Allocate draw channels
    TableUpdateDrawChannels(table);

    // Borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);

    // Reset fields after we used them in TableSetupResize()
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClipX)
        table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, 1);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);

    // Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);
}